

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumDescriptorProto::MergeFrom
          (EnumDescriptorProto *this,EnumDescriptorProto *from)

{
  uint uVar1;
  EnumDescriptorProto *in_RSI;
  EnumDescriptorProto *in_RDI;
  uint32 cached_has_bits;
  UnknownFieldSet *in_stack_ffffffffffffff18;
  EnumDescriptorProto *in_stack_ffffffffffffff20;
  EnumDescriptorProto *this_00;
  string *in_stack_ffffffffffffff38;
  EnumOptions *in_stack_ffffffffffffff98;
  
  this_00 = (EnumDescriptorProto *)&in_RSI->_internal_metadata_;
  if (((uint)(((InternalMetadataWithArena *)this_00)->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    if (((uint)(((InternalMetadataWithArena *)this_00)->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)this_00);
      in_stack_ffffffffffffff20 = this_00;
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
      in_stack_ffffffffffffff20 = this_00;
    }
    internal::InternalMetadataWithArena::DoMergeFrom
              ((InternalMetadataWithArena *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::MergeFrom
            ((RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *)
             in_stack_ffffffffffffff20,
             (RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *)
             in_stack_ffffffffffffff18);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange>::MergeFrom
            ((RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange> *)
             in_stack_ffffffffffffff20,
             (RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange> *)
             in_stack_ffffffffffffff18);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_ffffffffffffff20,
              (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_ffffffffffffff18);
  uVar1 = (in_RSI->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      _internal_name_abi_cxx11_((EnumDescriptorProto *)0x520fa9);
      _internal_set_name(in_RDI,in_stack_ffffffffffffff38);
    }
    if ((uVar1 & 2) != 0) {
      _internal_mutable_options(in_stack_ffffffffffffff20);
      _internal_options(in_RSI);
      EnumOptions::MergeFrom((EnumOptions *)in_RSI,in_stack_ffffffffffffff98);
    }
  }
  return;
}

Assistant:

void EnumDescriptorProto::MergeFrom(const EnumDescriptorProto& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.EnumDescriptorProto)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  value_.MergeFrom(from.value_);
  reserved_range_.MergeFrom(from.reserved_range_);
  reserved_name_.MergeFrom(from.reserved_name_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_name(from._internal_name());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_mutable_options()->PROTOBUF_NAMESPACE_ID::EnumOptions::MergeFrom(from._internal_options());
    }
  }
}